

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

MDD lddmc_extendnode(MDD mdd,uint32_t value,MDD ifeq)

{
  uint8_t uVar1;
  uint32_t value_00;
  mddnode_t n_00;
  uint64_t uVar2;
  uint64_t uVar3;
  MDD MVar4;
  uint32_t n_value;
  mddnode_t n;
  MDD ifeq_local;
  uint32_t value_local;
  MDD mdd_local;
  
  if (mdd < 2) {
    mdd_local = lddmc_makenode(value,ifeq,mdd);
  }
  else {
    n_00 = LDD_GETNODE(mdd);
    uVar1 = mddnode_getcopy(n_00);
    if (uVar1 == '\0') {
      value_00 = mddnode_getvalue(n_00);
      if (value_00 < value) {
        uVar2 = mddnode_getdown(n_00);
        uVar3 = mddnode_getright(n_00);
        MVar4 = lddmc_extendnode(uVar3,value,ifeq);
        mdd_local = lddmc_makenode(value_00,uVar2,MVar4);
      }
      else if (value_00 == value) {
        uVar2 = mddnode_getright(n_00);
        mdd_local = lddmc_makenode(value,ifeq,uVar2);
      }
      else {
        mdd_local = lddmc_makenode(value,ifeq,mdd);
      }
    }
    else {
      uVar2 = mddnode_getdown(n_00);
      uVar3 = mddnode_getright(n_00);
      MVar4 = lddmc_extendnode(uVar3,value,ifeq);
      mdd_local = lddmc_make_copynode(uVar2,MVar4);
    }
  }
  return mdd_local;
}

Assistant:

MDD
lddmc_extendnode(MDD mdd, uint32_t value, MDD ifeq)
{
    if (mdd <= lddmc_true) return lddmc_makenode(value, ifeq, mdd);

    mddnode_t n = LDD_GETNODE(mdd);
    if (mddnode_getcopy(n)) return lddmc_make_copynode(mddnode_getdown(n), lddmc_extendnode(mddnode_getright(n), value, ifeq));
    uint32_t n_value = mddnode_getvalue(n);
    if (n_value < value) return lddmc_makenode(n_value, mddnode_getdown(n), lddmc_extendnode(mddnode_getright(n), value, ifeq));
    if (n_value == value) return lddmc_makenode(value, ifeq, mddnode_getright(n));
    /* (n_value > value) */ return lddmc_makenode(value, ifeq, mdd);
}